

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O1

void __thiscall Node::OutputRemark(Node *this,ostream *os)

{
  byte bVar1;
  pointer pcVar2;
  ostream *poVar3;
  byte *pbVar4;
  bool bVar5;
  string Remark;
  long *local_60;
  long local_58;
  long local_50 [2];
  string local_40;
  
  pcVar2 = (this->TextValue)._M_dataplus._M_p;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + (this->TextValue)._M_string_length);
  if ((char)*local_60 == '!') {
    std::__cxx11::string::erase((ulong)&local_60,0);
  }
  if ((char)*local_60 == ' ') {
    std::__cxx11::string::erase((ulong)&local_60,0);
  }
  bVar5 = local_58 == 0;
  if (!bVar5) {
    do {
      pbVar4 = (byte *)((long)local_60 + local_58 + -1);
      bVar1 = *pbVar4;
      if (bVar1 < 0x20) {
        if (bVar1 == 9) {
          std::__cxx11::string::_M_erase((ulong)&local_60,(long)pbVar4 - (long)local_60);
        }
        else {
          if ((bVar1 != 10) && (bVar1 != 0xd)) {
LAB_0011dd5e:
            if ((!bVar5) && (((char)*local_60 != '\t' && ((char)*local_60 != '*')))) {
              std::__ostream_insert<char,std::char_traits<char>>(os,"// ",3);
              goto LAB_0011dca8;
            }
            break;
          }
          std::__cxx11::string::_M_erase((ulong)&local_60,(long)pbVar4 - (long)local_60);
        }
      }
      else if (bVar1 == 0x20) {
        std::__cxx11::string::_M_erase((ulong)&local_60,(long)pbVar4 - (long)local_60);
      }
      else if (bVar1 == 0x21) {
        std::__cxx11::string::_M_erase((ulong)&local_60,(long)pbVar4 - (long)local_60);
      }
      else {
        if (bVar1 != 0x26) goto LAB_0011dd5e;
        std::__cxx11::string::_M_erase((ulong)&local_60,(long)pbVar4 - (long)local_60);
      }
      bVar5 = local_58 == 0;
    } while (!bVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"//",2);
LAB_0011dca8:
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_60,local_58);
  if (this->Tree[0] != (Node *)0x0) {
    local_40._M_dataplus._M_p._0_1_ = 0x20;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_40,1);
    Expression_abi_cxx11_(&local_40,this->Tree[0]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                       local_40._M_dataplus._M_p._0_1_),local_40._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_),
                      local_40.field_2._M_allocated_capacity + 1);
    }
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return;
}

Assistant:

void Node::OutputRemark(
	std::ostream& os	/**< iostream to write C++ code to */
)
{
	std::string Remark = TextValue;

	//
	// Skip start of remark character
	//
	if (Remark[0] == '!')
	{
#ifdef STLREMOVE
		Remark.remove(0,1);
#else
		Remark.erase(0,1);
#endif
	}

	//
	// Skip extra white space
	//
	if (Remark[0] == ' ')
	{
#ifdef STLREMOVE
		Remark.remove(0,1);
#else
		Remark.erase(0,1);
#endif
	}

	//
	// Lose any junk at end of comment
	// (Yes, it does modify the original value)
	//
	while(Remark.length() > 0)
	{
		// Line continuation marker
		if (*(Remark.end() - 1) == '&')
		{
#ifdef STLREMOVE
			Remark.remove(Remark.end() - 1);
#else
			Remark.erase(Remark.end() - 1);
#endif
			continue;
		}

		// New Line
		if ((*(Remark.end() - 1) == '\n') ||
			(*(Remark.end() - 1) == '\r'))
		{
#ifdef STLREMOVE
			Remark.remove(Remark.end() - 1);
#else
			Remark.erase(Remark.end() - 1);
#endif
			continue;
		}

		// Space
		if (*(Remark.end() - 1) == ' ')
		{
#ifdef STLREMOVE
			Remark.remove(Remark.end() - 1);
#else
			Remark.erase(Remark.end() - 1);
#endif
			continue;
		}

		// Tab
		if (*(Remark.end() - 1) == '\t')
		{
#ifdef STLREMOVE
			Remark.remove(Remark.end() - 1);
#else
			Remark.erase(Remark.end() - 1);
#endif
			continue;
		}

		// Exclimation point
		if (*(Remark.end() - 1) == '!')
		{
#ifdef STLREMOVE
			Remark.remove(Remark.end() - 1);
#else
			Remark.erase(Remark.end() - 1);
#endif
			continue;
		}

		// Break out of loop
		break;
	}

	//
	// Dump out remark (and maybe add a space to the front)
	//
	if ((Remark.length() == 0) || (Remark[0] == '\t') || (Remark[0] == '*'))
	{
		os << "//" << Remark;
	}
	else
	{
		os << "// " << Remark;
	}

	//
	// There may be some extra stuff that needs printing
	//
	if (Tree[0] != 0)
	{
		os << ' ' << Tree[0]->Expression();
	}

	os << std::endl;

}